

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

void earlier_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *pFVar1;
  bool bVar2;
  Fl_Type *this;
  Fl_Type *g;
  
  bVar2 = true;
  pFVar1 = Fl_Type::first;
LAB_0018273a:
  do {
    do {
      this = pFVar1;
      if (this == (Fl_Type *)0x0) {
        if (!bVar2) {
          set_modflag(1);
          return;
        }
        return;
      }
      pFVar1 = this->next;
      g = this;
    } while (this->selected == '\0');
    do {
      g = g->prev;
      if (g == (Fl_Type *)0x0) goto LAB_0018273a;
    } while (this->level < g->level);
    if ((g->level == this->level) && (g->selected == '\0')) {
      Fl_Type::move_before(this,g);
      bVar2 = false;
    }
  } while( true );
}

Assistant:

void earlier_cb(Fl_Widget*,void*) {
  Fl_Type *f;
  int mod = 0;
  for (f = Fl_Type::first; f; ) {
    Fl_Type* nxt = f->next;
    if (f->selected) {
      Fl_Type* g;
      for (g = f->prev; g && g->level > f->level; g = g->prev) {/*empty*/}
      if (g && g->level == f->level && !g->selected) {
        f->move_before(g);
        mod = 1;
      }
    }
    f = nxt;
  }
  if (mod) set_modflag(1);
}